

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackJamTargetIdentifier.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::TrackJamTargetIdentifier::operator==
          (TrackJamTargetIdentifier *this,TrackJamTargetIdentifier *Value)

{
  TrackJamTargetIdentifier *Value_local;
  TrackJamTargetIdentifier *this_local;
  
  if ((this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16SiteID ==
      (Value->super_EntityIdentifier).super_SimulationIdentifier.m_ui16SiteID) {
    if ((this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16ApplicationID ==
        (Value->super_EntityIdentifier).super_SimulationIdentifier.m_ui16ApplicationID) {
      if (*(short *)&(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xc ==
          *(short *)&(Value->super_EntityIdentifier).super_SimulationIdentifier.field_0xc) {
        if ((this->super_EntityIdentifier).super_SimulationIdentifier.field_0xe ==
            (Value->super_EntityIdentifier).super_SimulationIdentifier.field_0xe) {
          if ((this->super_EntityIdentifier).super_SimulationIdentifier.field_0xf ==
              (Value->super_EntityIdentifier).super_SimulationIdentifier.field_0xf) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL TrackJamTargetIdentifier::operator == ( const TrackJamTargetIdentifier & Value ) const
{
    if( m_ui16SiteID        != Value.m_ui16SiteID )         return false;
    if( m_ui16ApplicationID != Value.m_ui16ApplicationID )  return false;
    if( m_ui16EntityID      != Value.m_ui16EntityID )       return false;
    if( m_ui8EmitterID      != Value.m_ui8EmitterID )       return false;
    if( m_ui8BeamID         != Value.m_ui8BeamID )          return false;
    return true;
}